

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxtick.cpp
# Opt level: O2

void processFile(MidiFile *midifile,Options *options)

{
  bool bVar1;
  int iVar2;
  ostream *this;
  double dVar3;
  allocator local_41;
  string local_40;
  
  this = std::operator<<((ostream *)&std::cout,"maxtick=");
  iVar2 = smf::MidiFile::getFileDurationInTicks(midifile);
  std::ostream::operator<<(this,iVar2);
  std::__cxx11::string::string((string *)&local_40,"quarters",&local_41);
  bVar1 = smf::Options::getBoolean(options,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"\tquarters=");
    dVar3 = smf::MidiFile::getFileDurationInQuarters(midifile);
    std::ostream::_M_insert<double>(dVar3);
  }
  std::__cxx11::string::string((string *)&local_40,"seconds",&local_41);
  bVar1 = smf::Options::getBoolean(options,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"\tseconds=");
    dVar3 = smf::MidiFile::getFileDurationInSeconds(midifile);
    std::ostream::_M_insert<double>(dVar3);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void processFile(MidiFile& midifile, Options& options) {
	cout << "maxtick=" << midifile.getFileDurationInTicks();
	if (options.getBoolean("quarters")) {
		cout << "\tquarters=" << midifile.getFileDurationInQuarters();
	}
	if (options.getBoolean("seconds")) {
		cout << "\tseconds=" << midifile.getFileDurationInSeconds();
	}
	cout << endl;
}